

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall
Catch::ExpressionResultBuilder::buildResult(ExpressionResultBuilder *this,AssertionInfo *info)

{
  bool bVar1;
  AssertionInfo *in_RSI;
  AssertionResult *in_RDI;
  AssertionResultData data;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  AssertionResultData *this_00;
  AssertionResult *data_00;
  AssertionResult *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  string local_d0 [32];
  string local_b0 [48];
  undefined1 local_80 [96];
  int local_20;
  
  data_00 = in_RDI;
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)in_stack_fffffffffffffef0,(AssertionResultData *)in_RSI);
  if ((((in_RSI->capturedExpression).field_0x0 & 1) == 0) || (local_20 != 0)) {
    if ((((in_RSI->capturedExpression).field_0x0 & 1) != 0) && (local_20 == 0x11)) {
      local_20 = 0;
    }
  }
  else {
    local_20 = 0x11;
  }
  std::__cxx11::ostringstream::str();
  this_00 = (AssertionResultData *)local_80;
  std::__cxx11::string::operator=((string *)(local_80 + 0x40),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  reconstructExpression_abi_cxx11_
            ((ExpressionResultBuilder *)data._32_8_,(AssertionInfo *)data._24_8_);
  std::__cxx11::string::operator=((string *)(local_80 + 0x20),local_b0);
  std::__cxx11::string::~string(local_b0);
  if (((in_RSI->capturedExpression).field_0x0 & 1) != 0) {
    bVar1 = std::operator==(&this_00->reconstructedExpression,
                            (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if (bVar1) {
      std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::__cxx11::string::operator=((string *)(local_80 + 0x20),local_d0);
      std::__cxx11::string::~string(local_d0);
    }
    else {
      std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (char *)this_00);
      std::__cxx11::string::operator=
                ((string *)(local_80 + 0x20),(string *)&stack0xffffffffffffff10);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    }
  }
  AssertionResult::AssertionResult(in_stack_fffffffffffffef0,in_RSI,(AssertionResultData *)data_00);
  AssertionResultData::~AssertionResultData(this_00);
  return data_00;
}

Assistant:

AssertionResult ExpressionResultBuilder::buildResult( AssertionInfo const& info ) const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if shouldNegate is set
        if( m_exprComponents.shouldNegate && data.resultType == ResultWas::Ok )
            data.resultType = ResultWas::ExpressionFailed;
        else if( m_exprComponents.shouldNegate && data.resultType == ResultWas::ExpressionFailed )
            data.resultType = ResultWas::Ok;

        data.message = m_stream.str();
        data.reconstructedExpression = reconstructExpression( info );
        if( m_exprComponents.shouldNegate ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( info, data );
    }